

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_2lin.cpp
# Opt level: O3

int R6P2Lin(MatrixXd *X,MatrixXd *u,int direction,double r0,RSDoublelinCameraPoseVector *results)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  void *pvVar9;
  PointerType ptr;
  double *pdVar10;
  undefined8 *puVar11;
  double dVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  double dVar40;
  double dVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  double dVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  double *pdVar50;
  double dVar51;
  double *pdVar52;
  Index row;
  long lVar53;
  double dVar54;
  long lVar55;
  double dVar56;
  double dVar57;
  long lVar58;
  double dVar59;
  double dVar60;
  VectorXd Ct;
  VectorXd p;
  vector<double,_std::allocator<double>_> v1;
  MatrixXd H;
  vector<double,_std::allocator<double>_> w3;
  vector<double,_std::allocator<double>_> w2;
  vector<double,_std::allocator<double>_> w1;
  vector<double,_std::allocator<double>_> v3;
  vector<double,_std::allocator<double>_> v2;
  MatrixXd Helimtr;
  VectorXd x;
  MatrixXd g;
  MatrixXd A;
  list<int,_std::allocator<int>_> b;
  MatrixXd Helim;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_318;
  double *local_300;
  double local_2f8;
  undefined8 uStack_2f0;
  double local_2e8;
  undefined8 uStack_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_2c8;
  long local_2b8;
  double *local_2b0;
  vector<double,_std::allocator<double>_> local_2a8;
  void *local_288;
  ulong local_280;
  DenseStorage<double,__1,__1,__1,_0> local_278;
  vector<double,_std::allocator<double>_> local_258;
  vector<double,_std::allocator<double>_> local_238;
  vector<double,_std::allocator<double>_> local_218;
  vector<double,_std::allocator<double>_> local_1f8;
  vector<double,_std::allocator<double>_> local_1d8;
  void *local_1c0;
  double local_1b8;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_148;
  DenseStorage<double,__1,__1,__1,_0> local_138;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  RSDoublelinCameraPoseVector *local_f0;
  RSDoublelinCameraPose local_e8;
  DenseStorage<double,__1,__1,__1,_0> local_78;
  _List_node_base local_60;
  undefined8 local_50;
  MatrixXd local_48;
  
  local_158._8_8_ = local_158._0_8_;
  local_278.m_data = (double *)0x0;
  local_278.m_rows = 0;
  local_278.m_cols = 0;
  local_f0 = results;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_278,0x108,0xc,0x16);
  pdVar10 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
            2;
  dVar12 = 0.0;
  uVar39 = (ulong)((double)local_278.m_cols == 4.94065645841247e-324);
  dVar40 = (double)local_278.m_rows;
  if ((double)local_278.m_cols == 4.94065645841247e-324) {
    dVar40 = dVar12;
  }
  dVar41 = (double)(2 - uVar39);
  uVar18 = uVar39;
  if (dVar41 == (double)local_278.m_cols) {
    dVar41 = dVar12;
    uVar18 = uVar39 + 1;
  }
  dVar60 = (double)((long)dVar41 + 1);
  dVar59 = dVar60;
  if (dVar60 == (double)local_278.m_cols) {
    dVar59 = dVar12;
  }
  lVar42 = (dVar60 == (double)local_278.m_cols) + uVar18;
  dVar20 = (double)((long)dVar59 + 1);
  dVar60 = dVar20;
  if (dVar20 == (double)local_278.m_cols) {
    dVar60 = dVar12;
  }
  lVar46 = (ulong)(dVar20 == (double)local_278.m_cols) + lVar42;
  dVar21 = (double)((long)dVar60 + 1);
  dVar20 = dVar21;
  if (dVar21 == (double)local_278.m_cols) {
    dVar20 = dVar12;
  }
  lVar43 = (ulong)(dVar21 == (double)local_278.m_cols) + lVar46;
  dVar22 = (double)((long)dVar20 + 1);
  dVar21 = dVar22;
  if (dVar22 == (double)local_278.m_cols) {
    dVar21 = dVar12;
  }
  lVar47 = (ulong)(dVar22 == (double)local_278.m_cols) + lVar43;
  dVar23 = (double)((long)dVar21 + 1);
  dVar22 = dVar23;
  if (dVar23 == (double)local_278.m_cols) {
    dVar22 = dVar12;
  }
  lVar44 = (ulong)(dVar23 == (double)local_278.m_cols) + lVar47;
  dVar23 = (double)((long)dVar22 + 1);
  local_158._0_8_ = dVar23;
  if (dVar23 == (double)local_278.m_cols) {
    local_158._0_8_ = dVar12;
  }
  dVar24 = (double)(local_158._0_8_ + 1);
  local_168 = dVar24;
  if (dVar24 == (double)local_278.m_cols) {
    local_168 = dVar12;
  }
  dVar25 = (double)((long)local_168 + 1);
  local_178 = dVar25;
  if (dVar25 == (double)local_278.m_cols) {
    local_178 = dVar12;
  }
  dVar26 = (double)((long)local_178 + 1);
  local_188 = dVar26;
  if (dVar26 == (double)local_278.m_cols) {
    local_188 = dVar12;
  }
  dVar27 = (double)((long)local_188 + 1);
  local_198 = dVar27;
  if (dVar27 == (double)local_278.m_cols) {
    local_198 = dVar12;
  }
  dVar28 = (double)((long)local_198 + 1);
  local_1a8 = dVar28;
  if (dVar28 == (double)local_278.m_cols) {
    local_1a8 = dVar12;
  }
  dVar29 = (double)((long)local_1a8 + 1);
  dVar30 = dVar29;
  if (dVar29 == (double)local_278.m_cols) {
    dVar30 = dVar12;
  }
  dVar31 = (double)((long)dVar30 + 1);
  dVar32 = dVar31;
  if (dVar31 == (double)local_278.m_cols) {
    dVar32 = dVar12;
  }
  dVar33 = (double)((long)dVar32 + 1);
  dVar34 = dVar33;
  if (dVar33 == (double)local_278.m_cols) {
    dVar34 = dVar12;
  }
  dVar1 = (double)((long)dVar34 + 1);
  dVar56 = dVar1;
  if (dVar1 == (double)local_278.m_cols) {
    dVar56 = dVar12;
  }
  dVar2 = (double)((long)dVar56 + 1);
  dVar57 = dVar2;
  if (dVar2 == (double)local_278.m_cols) {
    dVar57 = dVar12;
  }
  dVar3 = (double)((long)dVar57 + 1);
  dVar54 = dVar3;
  if (dVar3 == (double)local_278.m_cols) {
    dVar54 = dVar12;
  }
  dVar4 = (double)((long)dVar54 + 1);
  dVar51 = dVar4;
  if (dVar4 == (double)local_278.m_cols) {
    dVar51 = dVar12;
  }
  dVar5 = (double)((long)dVar51 + 1);
  dVar45 = dVar5;
  if (dVar5 == (double)local_278.m_cols) {
    dVar45 = dVar12;
  }
  lVar35 = (ulong)(dVar23 == (double)local_278.m_cols) + lVar44;
  lVar13 = (ulong)(dVar24 == (double)local_278.m_cols) + lVar35;
  lVar36 = (ulong)(dVar25 == (double)local_278.m_cols) + lVar13;
  lVar14 = (ulong)(dVar26 == (double)local_278.m_cols) + lVar36;
  lVar37 = (ulong)(dVar27 == (double)local_278.m_cols) + lVar14;
  lVar15 = (ulong)(dVar28 == (double)local_278.m_cols) + lVar37;
  lVar49 = (ulong)(dVar29 == (double)local_278.m_cols) + lVar15;
  lVar16 = (ulong)(dVar31 == (double)local_278.m_cols) + lVar49;
  lVar55 = (ulong)(dVar33 == (double)local_278.m_cols) + lVar16;
  lVar58 = (ulong)(dVar1 == (double)local_278.m_cols) + lVar55;
  lVar38 = (ulong)(dVar2 == (double)local_278.m_cols) + lVar58;
  lVar53 = (ulong)(dVar3 == (double)local_278.m_cols) + lVar38;
  lVar48 = ((ulong)(dVar4 == (double)local_278.m_cols) + lVar53) * 8;
  lVar6 = lVar48 + (long)dVar45 * local_278.m_rows * 8 +
          (ulong)(dVar5 == (double)local_278.m_cols) * 8;
  lVar48 = lVar48 + (long)dVar51 * local_278.m_rows * 8;
  local_f8 = lVar53 * 8 + (long)dVar54 * local_278.m_rows * 8;
  local_100 = lVar38 * 8 + (long)dVar57 * local_278.m_rows * 8;
  local_108 = lVar58 * 8 + (long)dVar56 * local_278.m_rows * 8;
  local_2b8 = lVar55 * 8 + (long)dVar34 * local_278.m_rows * 8;
  local_110 = lVar16 * 8 + (long)dVar32 * local_278.m_rows * 8;
  local_118 = lVar49 * 8 + (long)dVar30 * local_278.m_rows * 8;
  lVar15 = lVar15 * 8 + (long)local_1a8 * local_278.m_rows * 8;
  lVar16 = lVar37 * 8 + (long)local_198 * local_278.m_rows * 8;
  lVar14 = lVar14 * 8 + (long)local_188 * local_278.m_rows * 8;
  lVar36 = lVar36 * 8 + (long)local_178 * local_278.m_rows * 8;
  lVar13 = lVar13 * 8 + (long)local_168 * local_278.m_rows * 8;
  lVar35 = lVar35 * 8 + local_158._0_8_ * local_278.m_rows * 8;
  lVar44 = lVar44 * 8 + (long)dVar22 * local_278.m_rows * 8;
  lVar47 = lVar47 * 8 + (long)dVar21 * local_278.m_rows * 8;
  lVar43 = lVar43 * 8 + (long)dVar20 * local_278.m_rows * 8;
  lVar46 = lVar46 * 8 + (long)dVar60 * local_278.m_rows * 8;
  lVar42 = lVar42 * 8 + (long)dVar59 * local_278.m_rows * 8;
  lVar37 = uVar18 * 8 + (long)dVar41 * local_278.m_rows * 8;
  lVar49 = uVar39 * 8 + (long)dVar40 * 8;
  local_2b0 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_300 = local_278.m_data + (long)dVar57 * local_278.m_rows + lVar38 + 1;
  lVar38 = 0;
  do {
    local_2d8 = pdVar10[-2];
    local_2f8 = pdVar10[-1];
    dVar40 = *pdVar10;
    dVar12 = *(double *)((long)local_2b0 + lVar38);
    dVar41 = *(double *)((long)local_2b0 + lVar38 + 8);
    dVar20 = -dVar41;
    local_2e8 = local_2f8 * r0;
    uStack_2e0 = 0;
    dVar60 = -local_2e8;
    dVar59 = dVar40 * dVar41;
    uStack_2f0 = 0;
    if (direction == 0) {
      *(undefined8 *)((long)local_278.m_data + lVar38) = 0;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar49) = 0xbff0000000000000;
      *(double *)((long)local_278.m_data + lVar38 + lVar37) = dVar41;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar42) = 0;
      *(double *)((long)local_278.m_data + lVar38 + lVar46) = r0 - dVar12;
      *(double *)((long)local_278.m_data + lVar38 + lVar43) = dVar41 * dVar12 + dVar20 * r0;
      dVar60 = local_2f8 * dVar12 + dVar60;
      dVar21 = -dVar59 * dVar12;
      *(double *)((long)local_278.m_data + lVar38 + lVar47) = dVar21 + dVar60 + dVar59 * r0;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar44) = 0;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar35) = 0;
      dVar25 = -local_2d8;
      dVar20 = local_2d8 * r0 + dVar12 * dVar25;
      *(double *)((long)local_278.m_data + lVar38 + lVar13) = dVar20;
      *(double *)((long)local_278.m_data + lVar38 + lVar36) = dVar59 * r0 + dVar21;
      dVar22 = dVar40 * dVar12;
      *(double *)((long)local_278.m_data + lVar38 + lVar14) = dVar40 * r0 - dVar22;
      dVar21 = local_2d8 * dVar41 * dVar12;
      dVar26 = local_2d8 * dVar41 * r0;
      *(double *)((long)local_278.m_data + lVar38 + lVar16) = dVar21 - dVar26;
      dVar24 = local_2f8 * dVar41;
      *(double *)((long)local_278.m_data + lVar38 + lVar15) = dVar24 * dVar12 + -dVar24 * r0;
      *(double *)((long)local_278.m_data + lVar38 + local_118) = dVar60;
      *(double *)((long)local_278.m_data + lVar38 + local_110) = dVar24 + dVar40;
      *(double *)((long)local_278.m_data + lVar38 + local_2b8) = dVar41 * dVar25;
      *(double *)((long)local_278.m_data + lVar38 + local_108) = dVar25;
      dVar23 = dVar22 + -dVar40 * r0;
      *(double *)((long)local_300 + lVar38 + -8) = dVar24 * dVar12 + dVar23 + -dVar24 * r0;
      *(double *)((long)local_278.m_data + lVar38 + local_f8) = dVar26 - dVar21;
      *(double *)((long)local_278.m_data + lVar38 + lVar48) = dVar20;
      *(double *)((long)local_278.m_data + lVar38 + lVar6) = dVar59 - local_2f8;
      *(undefined8 *)((long)local_278.m_data + lVar38 + 8) = 0x3ff0000000000000;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar49 + 8) = 0;
      *(double *)((long)local_278.m_data + lVar38 + lVar37 + 8) = -dVar12;
      *(double *)((long)local_278.m_data + lVar38 + lVar42 + 8) = dVar12 - r0;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar46 + 8) = 0;
      *(double *)((long)local_278.m_data + lVar38 + lVar43 + 8) = dVar12 * r0 - dVar12 * dVar12;
      *(double *)((long)local_278.m_data + lVar38 + lVar47 + 8) =
           -dVar40 * r0 * dVar12 + dVar22 * dVar12;
      *(double *)((long)local_278.m_data + lVar38 + lVar44 + 8) = dVar60;
      *(double *)((long)local_278.m_data + lVar38 + lVar35 + 8) = dVar23;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar13 + 8) = 0;
      *(double *)((long)local_278.m_data + lVar38 + lVar36 + 8) =
           (dVar22 * dVar12 + dVar20) - dVar22 * r0;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar14 + 8) = 0;
      *(double *)((long)local_278.m_data + lVar38 + lVar16 + 8) =
           dVar12 * dVar25 * dVar12 + local_2d8 * r0 * dVar12;
      dVar41 = dVar12 * -local_2f8;
      dVar60 = dVar41 * dVar12 + local_2e8 * dVar12;
      *(double *)((long)local_278.m_data + lVar38 + lVar15 + 8) = dVar60;
      *(double *)((long)local_278.m_data + lVar38 + local_118 + 8) = dVar20;
      *(double *)((long)local_278.m_data + lVar38 + local_110 + 8) = dVar41;
      dVar59 = local_2d8 * dVar12;
      *(double *)((long)local_278.m_data + lVar38 + local_2b8 + 8) = dVar40 + dVar59;
      *(double *)((long)local_278.m_data + lVar38 + local_108 + 8) = -local_2f8;
      *(double *)((long)local_300 + lVar38) = dVar60;
      *(double *)((long)local_278.m_data + lVar38 + local_f8 + 8) =
           (dVar12 * dVar59 + dVar23) - dVar59 * r0;
      *(double *)((long)local_278.m_data + lVar38 + lVar48 + 8) = dVar41 + local_2e8;
      *(double *)((long)local_278.m_data + lVar38 + lVar6 + 8) = local_2d8 - dVar22;
    }
    else {
      *(undefined8 *)((long)local_278.m_data + lVar38) = 0;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar49) = 0xbff0000000000000;
      *(double *)((long)local_278.m_data + lVar38 + lVar37) = dVar41;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar42) = 0;
      *(double *)((long)local_278.m_data + lVar38 + lVar46) = r0 - dVar41;
      *(double *)((long)local_278.m_data + lVar38 + lVar43) = dVar41 * dVar41 + dVar20 * r0;
      dVar23 = local_2f8 * dVar41;
      *(double *)((long)local_278.m_data + lVar38 + lVar47) =
           dVar59 * r0 + -dVar59 * dVar41 + dVar23 + dVar60;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar44) = 0;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar35) = 0;
      dVar21 = -dVar40;
      local_158._8_4_ = 0;
      local_158._0_8_ = dVar21;
      local_158._12_4_ = 0x80000000;
      dVar24 = dVar41 * dVar21;
      dVar25 = dVar40 * r0;
      local_168 = dVar24 * dVar41 + dVar25 * dVar41;
      uStack_160 = 0;
      dVar28 = dVar41 * -local_2d8;
      dVar26 = local_2d8 * r0;
      local_188 = dVar26 + dVar28;
      uStack_180 = 0;
      *(double *)((long)local_278.m_data + lVar38 + lVar13) = local_188;
      *(double *)((long)local_278.m_data + lVar38 + lVar36) = local_168;
      *(double *)((long)local_278.m_data + lVar38 + lVar14) = dVar25 + dVar24;
      dVar22 = local_2d8 * dVar41;
      local_198 = dVar26 * dVar41;
      uStack_1a0 = 0;
      uStack_190 = 0;
      local_178 = dVar22 * dVar41 - local_198;
      uStack_170 = 0;
      *(double *)((long)local_278.m_data + lVar38 + lVar16) = local_178;
      dVar27 = dVar23 * dVar41;
      *(double *)((long)local_278.m_data + lVar38 + lVar15) = dVar60 * dVar41 + dVar27;
      *(double *)((long)local_278.m_data + lVar38 + local_118) = dVar23 + dVar60;
      *(double *)((long)local_278.m_data + lVar38 + local_110) = dVar40 + dVar23;
      *(double *)((long)local_278.m_data + lVar38 + local_2b8) = dVar28;
      *(double *)((long)local_278.m_data + lVar38 + local_108) = -local_2d8;
      local_2d8 = local_2d8 * dVar12 + dVar23;
      *(double *)((long)local_300 + lVar38 + -8) = (dVar59 - dVar25) + dVar27 + -dVar23 * r0;
      *(double *)((long)local_278.m_data + lVar38 + local_f8) = dVar28 * dVar41 + local_198;
      *(double *)((long)local_278.m_data + lVar38 + lVar48) = local_188;
      *(double *)((long)local_278.m_data + lVar38 + lVar6) = dVar59 - local_2f8;
      *(double *)((long)local_278.m_data + lVar38 + 8) = dVar20;
      *(double *)((long)local_278.m_data + lVar38 + lVar49 + 8) = dVar12;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar37 + 8) = 0;
      *(double *)((long)local_278.m_data + lVar38 + lVar42 + 8) = dVar20 * dVar41 + dVar41 * r0;
      *(double *)((long)local_278.m_data + lVar38 + lVar46 + 8) = dVar41 * dVar12 - dVar12 * r0;
      dVar40 = dVar12 * -local_2f8 * dVar41;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar43 + 8) = 0;
      *(double *)((long)local_278.m_data + lVar38 + lVar47 + 8) = local_2e8 * dVar12 + dVar40;
      *(double *)((long)local_278.m_data + lVar38 + lVar44 + 8) =
           -local_2f8 * dVar41 * dVar41 + local_2e8 * dVar41;
      *(double *)((long)local_278.m_data + lVar38 + lVar35 + 8) = local_168;
      *(double *)((long)local_278.m_data + lVar38 + lVar13 + 8) = dVar22 * dVar12 - dVar26 * dVar12;
      *(double *)((long)local_278.m_data + lVar38 + lVar36 + 8) = local_178;
      *(double *)((long)local_278.m_data + lVar38 + lVar14 + 8) = dVar59 * dVar12 - dVar25 * dVar12;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar16 + 8) = 0;
      *(undefined8 *)((long)local_278.m_data + lVar38 + lVar15 + 8) = 0;
      *(double *)((long)local_278.m_data + lVar38 + local_118 + 8) =
           (dVar22 * dVar41 - dVar22 * r0) + dVar40 + local_2e8 * dVar12;
      *(double *)((long)local_278.m_data + lVar38 + local_110 + 8) = dVar21 * dVar12;
      *(double *)((long)local_278.m_data + lVar38 + local_2b8 + 8) = dVar24;
      *(double *)((long)local_278.m_data + lVar38 + local_108 + 8) = local_2d8;
      *(double *)((long)local_300 + lVar38) = dVar24 * dVar12 + dVar25 * dVar12;
      *(double *)((long)local_278.m_data + lVar38 + local_f8 + 8) = local_168;
      *(double *)((long)local_278.m_data + lVar38 + lVar48 + 8) =
           (-dVar23 * r0 + dVar27 + dVar22 * dVar12) - dVar26 * dVar12;
      *(double *)((long)local_278.m_data + lVar38 + lVar6 + 8) = local_2f8 * dVar12 + dVar28;
      local_1a8 = dVar59;
    }
    uStack_2d0 = 0;
    pdVar10 = pdVar10 + 3;
    lVar38 = lVar38 + 0x10;
  } while (lVar38 != 0x60);
  local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_278;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_48,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_e8);
  local_60._M_next = &local_60;
  local_50 = 0;
  local_60._M_prev = local_60._M_next;
  colEchelonForm(&local_48,(list<int,_std::allocator<int>_> *)local_60._M_next);
  local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1c0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_e8);
  dVar40 = local_1b8;
  pvVar9 = local_1c0;
  local_138.m_cols = 0;
  local_138.m_data = (double *)0x0;
  local_138.m_rows = 0;
  local_2c8.m_storage.m_data = (double *)0x0;
  local_2c8.m_storage.m_rows = 0;
  local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,0x3c,10,6);
  pdVar10 = local_138.m_data;
  if (0 < local_138.m_cols) {
    pdVar17 = (double *)((long)pvVar9 + (long)dVar40 * 0x60 + 0x30);
    lVar42 = 0;
    pdVar50 = local_138.m_data;
    do {
      if (0 < local_138.m_rows) {
        lVar46 = 0;
        pdVar52 = pdVar17;
        do {
          pdVar50[lVar46] = *pdVar52;
          lVar46 = lVar46 + 1;
          pdVar52 = pdVar52 + (long)dVar40;
        } while (local_138.m_rows != lVar46);
      }
      lVar42 = lVar42 + 1;
      pdVar17 = pdVar17 + 1;
      pdVar50 = pdVar50 + local_138.m_rows;
    } while (lVar42 != local_138.m_cols);
  }
  if (local_2c8.m_storage.m_rows == 0x3c) {
    uVar18 = 0x3c;
    uVar39 = 0x3c;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_2c8,0x3c,1);
    uVar18 = local_2c8.m_storage.m_rows - (local_2c8.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
    uVar39 = local_2c8.m_storage.m_rows;
    if (local_2c8.m_storage.m_rows < 2) goto LAB_001be25a;
  }
  lVar42 = 0;
  do {
    pdVar50 = pdVar10 + lVar42;
    dVar40 = pdVar50[1];
    local_2c8.m_storage.m_data[lVar42] = *pdVar50;
    (local_2c8.m_storage.m_data + lVar42)[1] = dVar40;
    lVar42 = lVar42 + 2;
  } while (lVar42 < (long)uVar18);
LAB_001be25a:
  if ((long)uVar18 < (long)uVar39) {
    do {
      local_2c8.m_storage.m_data[uVar18] = pdVar10[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar39 != uVar18);
  }
  solveVW3var(local_2c8.m_storage.m_data,&local_2a8,&local_1d8,&local_1f8,&local_218,&local_238,
              &local_258);
  local_148.m_storage.m_data = (double *)0x0;
  local_148.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_148,0x10,1);
  local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)((long)local_1b8 * 0x30 + (long)local_1c0);
  local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 2.96439387504748e-323;
  local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 7.90505033345994e-323;
  local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 2.96439387504748e-323;
  local_e8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = local_1b8;
  local_78.m_data = (double *)0x0;
  local_78.m_rows = 0;
  local_78.m_cols = 0;
  local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_1c0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_78,0x60,6,0x10);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_78,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_e8,
             (assign_op<double,_double> *)&local_288);
  local_318.m_storage.m_data = (double *)0x0;
  local_318.m_storage.m_rows = 0;
  pdVar10 = (double *)malloc(0x30);
  if (pdVar10 != (double *)0x0) {
    local_318.m_storage.m_rows = 6;
    local_318.m_storage.m_data = pdVar10;
    if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar39 = 0;
      do {
        *local_148.m_storage.m_data =
             local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39] *
             local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[1] =
             local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39] *
             local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[2] =
             local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39] *
             local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[3] =
             local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39] *
             local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[4] =
             local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39] *
             local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[5] =
             local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39] *
             local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[6] =
             local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39] *
             local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[7] =
             local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39] *
             local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[8] =
             local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39] *
             local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[9] =
             local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[10] =
             local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[0xb] =
             local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[0xc] =
             local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[0xd] =
             local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[0xe] =
             local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar39];
        local_148.m_storage.m_data[0xf] = 1.0;
        local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = (double)&local_78;
        local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = (double)&local_148;
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                  ((Matrix<double,_1,1,0,_1,1> *)&local_288,
                   (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_e8);
        pvVar9 = local_288;
        uVar18 = local_280;
        if (local_318.m_storage.m_rows != local_280) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_318,local_280,1);
          uVar18 = local_318.m_storage.m_rows;
        }
        uVar19 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar18) {
          lVar42 = 0;
          do {
            pdVar10 = (double *)((long)pvVar9 + lVar42 * 8);
            dVar40 = pdVar10[1];
            local_318.m_storage.m_data[lVar42] = *pdVar10;
            (local_318.m_storage.m_data + lVar42)[1] = dVar40;
            lVar42 = lVar42 + 2;
          } while (lVar42 < (long)uVar19);
        }
        if ((long)uVar19 < (long)uVar18) {
          do {
            local_318.m_storage.m_data[uVar19] = *(double *)((long)pvVar9 + uVar19 * 8);
            uVar19 = uVar19 + 1;
          } while (uVar18 != uVar19);
        }
        free(local_288);
        local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar39];
        local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar39];
        local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar39];
        local_e8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar39];
        local_e8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar39];
        local_e8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar39];
        local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = *local_318.m_storage.m_data;
        local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_318.m_storage.m_data[1];
        local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_318.m_storage.m_data[2];
        local_e8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_318.m_storage.m_data[3];
        local_e8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_318.m_storage.m_data[4];
        local_e8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_318.m_storage.m_data[5];
        local_e8.f = 1.0;
        local_e8.rd = 0.0;
        std::vector<RSDoublelinCameraPose,_std::allocator<RSDoublelinCameraPose>_>::
        emplace_back<RSDoublelinCameraPose>(local_f0,&local_e8);
        uVar39 = uVar39 + 1;
      } while (uVar39 < (ulong)((long)local_2a8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_2a8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    free(local_318.m_storage.m_data);
    free(local_78.m_data);
    free(local_148.m_storage.m_data);
    if (local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    free(local_2c8.m_storage.m_data);
    free(local_138.m_data);
    free(local_1c0);
    p_Var8 = local_60._M_next;
    while (p_Var8 != &local_60) {
      p_Var7 = (((_List_base<int,_std::allocator<int>_> *)&p_Var8->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var8);
      p_Var8 = p_Var7;
    }
    free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free(local_278.m_data);
    return 0;
  }
  puVar11 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar11 = std::ostream::_M_insert<long>;
  __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

int R6P2Lin(const Eigen::MatrixXd & X, const Eigen::MatrixXd & u, int direction, double r0, RSDoublelinCameraPoseVector * results){
	Eigen::MatrixXd H(12, 22);
	double X_1, X_2, X_3, r, c, c0;
	bool planar = false;
	if (direction!=0){
		c0 = r0;
	}
	

	for (int i = 0; i < 6; i++)
	{
		X_1 = X(i * 3);
		X_2 = X(i * 3 + 1);
		X_3 = X(i * 3 + 2);
		r = u(i * 2);
		c = u(i * 2 + 1);

		if (direction == 0){
			H.row(i * 2) << 0, -1, c, 0, r0 - r, c*r - c*r0, X_2*r - X_2*r0 - X_3*c*r + X_3*c*r0, 0, 0, X_1*r0 - X_1*r, X_3*c*r0 - X_3*c*r, X_3*r0 - X_3*r, X_1*c*r - X_1*c*r0, X_2*c*r - X_2*c*r0, X_2*r - X_2*r0, X_3 + X_2*c, -X_1*c, -X_1, X_3*r - X_3*r0 + X_2*c*r - X_2*c*r0, X_1*c*r0 - X_1*c*r, X_1*r0 - X_1*r, X_3*c - X_2;
			H.row(i * 2 + 1) << 1, 0, -r, r - r0, 0, -r*r + r0*r, X_3*r*r - X_3*r0*r, X_2*r - X_2*r0, X_3*r - X_3*r0, 0, X_1*r0 - X_1*r + X_3*r*r - X_3*r*r0, 0, -X_1*r*r + X_1*r0*r, -X_2*r*r + X_2*r0*r, X_1*r0 - X_1*r, -X_2*r, X_3 + X_1*r, -X_2, -X_2*r*r + X_2*r0*r, X_3*r - X_3*r0 + X_1*r*r - X_1*r*r0, X_2*r0 - X_2*r, X_1 - X_3*r;
		}
		else{
			H.row(i * 2) << 0, -1, c, 0, c0 - c, c*c - c0*c, X_2*c - X_2*c0 - X_3*c*c + X_3*c*c0, 0, 0, X_1*c0 - X_1*c, -X_3*c*c + X_3*c0*c, X_3*c0 - X_3*c, X_1*c*c - X_1*c0*c, X_2*c*c - X_2*c0*c, X_2*c - X_2*c0, X_3 + X_2*c, -X_1*c, -X_1, X_3*c - X_3*c0 + X_2*c*c - X_2*c*c0, -X_1*c*c + X_1*c0*c, X_1*c0 - X_1*c, X_3*c - X_2;
			H.row(i * 2 + 1) << -c, r, 0, -c*c + c0*c, c*r - c0*r, 0, X_2*c0*r - X_2*c*r, -X_2*c*c + X_2*c0*c, -X_3*c*c+ X_3*c0*c, X_1*c*r - X_1*c0*r, X_1*c*c - X_1*c0*c, X_3*c*r - X_3*c0*r, 0, 0, X_1*c*c - X_1*c*c0 - X_2*c*r + X_2*c0*r, -X_3*r, -X_3*c, X_2*c + X_1*r, X_3*c0*r - X_3*c*r, -X_3*c*c + X_3*c0*c, X_2*c*c - X_2*c*c0 + X_1*c*r - X_1*c0*r, X_2*r - X_1*c;
		}
	}
	
	Eigen::MatrixXd Helim = H.transpose();
	std::list<int> b;
	colEchelonForm(Helim, b);

	Eigen::MatrixXd Helimtr = Helim.transpose();
	
	Eigen::MatrixXd g; 
	Eigen::VectorXd p;
	std::vector<double> v1, v2, v3, w1, w2, w3;
	
    g = Helimtr.block(6, 12, 6, 10).transpose();
    p = Eigen::Map<Eigen::VectorXd>(g.data(), 6 * 10);
    solveVW3var(p.data(), v1, v2, v3, w1, w2, w3);
	
	Eigen::VectorXd x(16,1);
	Eigen::MatrixXd A = Helimtr.block(0,6,6,16);
	Eigen::VectorXd Ct(6);
	Eigen::Vector3d Cres;

	for (int i = 0; i < v1.size(); i++)
	{
		x << v1[i]*w1[i], v1[i]*w2[i], v1[i]*w3[i], v2[i]*w1[i], v2[i]*w2[i], v2[i]*w3[i], v3[i]*w1[i], v3[i]*w2[i], v3[i]*w3[i], v1[i], v2[i], v3[i], w1[i], w2[i], w3[i], 1;
		Ct = -A*x;
		Eigen::Vector3d vr, wr;
		vr << v1[i], v2[i], v3[i];
		wr << w1[i], w2[i], w3[i];
		results->push_back({vr, Ct.segment(0, 3), wr, Ct.segment(3, 3), 1, 0});
	}

    return 0;
}